

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::getECPublicKey(SoftHSM *this,ECPublicKey *publicKey,Token *token,OSObject *key)

{
  int iVar1;
  undefined1 uVar2;
  undefined7 uVar3;
  uchar *in_R8;
  size_t in_R9;
  CK_RV CVar4;
  ByteString local_a0;
  ByteString point;
  ByteString group;
  
  uVar3 = (undefined7)((ulong)key >> 8);
  uVar2 = token == (Token *)0x0 || publicKey == (ECPublicKey *)0x0;
  if (key == (OSObject *)0x0 || (token == (Token *)0x0 || publicKey == (ECPublicKey *)0x0)) {
    return 7;
  }
  iVar1 = (*key->_vptr_OSObject[4])(key,2,0);
  ByteString::ByteString(&group);
  ByteString::ByteString(&point);
  if ((char)iVar1 == '\0') {
    (*key->_vptr_OSObject[6])(&local_a0,key,0x180);
    ByteString::operator=(&group,&local_a0);
    ByteString::~ByteString(&local_a0);
    (*key->_vptr_OSObject[6])(&local_a0,key,0x181);
    ByteString::operator=(&point,&local_a0);
    ByteString::~ByteString(&local_a0);
  }
  else {
    (*key->_vptr_OSObject[6])(&local_a0,key,0x180);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_a0,(uchar *)&group,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_a0);
    CVar4 = 5;
    if ((char)iVar1 == '\0') goto LAB_001378f7;
    (*key->_vptr_OSObject[6])(&local_a0,key,0x181);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_a0,(uchar *)&point,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_a0);
    if ((char)iVar1 == '\0') goto LAB_001378f7;
  }
  (**(code **)(*(long *)publicKey + 0x38))(publicKey,&group);
  (**(code **)(*(long *)publicKey + 0x40))(publicKey,&point);
  CVar4 = 0;
LAB_001378f7:
  ByteString::~ByteString(&point);
  ByteString::~ByteString(&group);
  return CVar4;
}

Assistant:

CK_RV SoftHSM::getECPublicKey(ECPublicKey* publicKey, Token* token, OSObject* key)
{
	if (publicKey == NULL) return CKR_ARGUMENTS_BAD;
	if (token == NULL) return CKR_ARGUMENTS_BAD;
	if (key == NULL) return CKR_ARGUMENTS_BAD;

	// Get the CKA_PRIVATE attribute, when the attribute is not present use default false
	bool isKeyPrivate = key->getBooleanValue(CKA_PRIVATE, false);

	// EC Public Key Attributes
	ByteString group;
	ByteString point;
	if (isKeyPrivate)
	{
		bool bOK = true;
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_EC_PARAMS), group);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_EC_POINT), point);
		if (!bOK)
			return CKR_GENERAL_ERROR;
	}
	else
	{
		group = key->getByteStringValue(CKA_EC_PARAMS);
		point = key->getByteStringValue(CKA_EC_POINT);
	}

	publicKey->setEC(group);
	publicKey->setQ(point);

	return CKR_OK;
}